

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int GetExpressScanDataResponseFromThreadRPLIDARx
              (RPLIDAR *pRPLIDAR,double *pDistances,double *pAngles,BOOL *pbNewScan)

{
  int iVar1;
  long lVar2;
  long lVar3;
  CRITICAL_SECTION *__mutex;
  
  __mutex = RPLIDARCS;
  lVar2 = 0;
  lVar3 = 0;
  do {
    if (*(RPLIDAR **)((long)addrsRPLIDAR + lVar2 * 2) == pRPLIDAR) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      memcpy(pDistances,(void *)((long)distancesRPLIDAR[0] + lVar3),0x100);
      memcpy(pAngles,(void *)((long)anglesRPLIDAR[0] + lVar3),0x100);
      *pbNewScan = *(BOOL *)((long)bNewScanRPLIDAR + lVar2);
      iVar1 = *(int *)((long)resRPLIDAR + lVar2);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return iVar1;
    }
    __mutex = __mutex + 1;
    lVar3 = lVar3 + 0x10000;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int GetExpressScanDataResponseFromThreadRPLIDARx(RPLIDAR* pRPLIDAR, double* pDistances, double* pAngles, BOOL* pbNewScan)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&RPLIDARCS[id]);
	memcpy(pDistances, distancesRPLIDAR[id], NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
	memcpy(pAngles, anglesRPLIDAR[id], NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
	*pbNewScan = bNewScanRPLIDAR[id];
	res = resRPLIDAR[id];
	LeaveCriticalSection(&RPLIDARCS[id]);

	return res;
}